

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_l2_norm(ggml_context *ctx,ggml_tensor *a,float eps)

{
  ggml_tensor *pgVar1;
  undefined8 in_RSI;
  ggml_tensor *in_RDI;
  undefined4 unaff_retaddr;
  
  pgVar1 = ggml_l2_norm_impl((ggml_context *)CONCAT44(eps,unaff_retaddr),in_RDI,
                             (float)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_l2_norm(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        float                 eps) {
    return ggml_l2_norm_impl(ctx, a, eps, false);
}